

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

ImageT<unsigned_char,_1U> * __thiscall
ImageT<unsigned_char,_1U>::normalize(ImageT<unsigned_char,_1U> *this)

{
  uint32_t uVar1;
  ImageT<unsigned_char,_1U> *in_RDI;
  Color *c;
  uint32_t i;
  uint32_t pixelCount;
  uint local_10;
  
  uVar1 = Image::getPixelCount(&in_RDI->super_Image);
  for (local_10 = 0; local_10 < uVar1; local_10 = local_10 + 1) {
    color<unsigned_char,_1U>::normalize(in_RDI->pixels + local_10);
  }
  return in_RDI;
}

Assistant:

virtual ImageT& normalize() override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            c.normalize();
        }
        return *this;
    }